

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGate2.hpp
# Opt level: O0

bool __thiscall
qclab::qgates::PointerGate2<float>::equals(PointerGate2<float> *this,QObject<float> *other)

{
  QObject<float> *pQVar1;
  QObject<float> *other_00;
  PointerGate2<float> *local_40;
  G *p;
  QObject<float> *other_local;
  PointerGate2<float> *this_local;
  
  if (other == (QObject<float> *)0x0) {
    local_40 = (PointerGate2<float> *)0x0;
  }
  else {
    local_40 = (PointerGate2<float> *)__dynamic_cast(other,&QObject<float>::typeinfo,&typeinfo,0);
  }
  if (local_40 == (PointerGate2<float> *)0x0) {
    pQVar1 = &ptr(this)->super_QObject<float>;
    this_local._7_1_ = QObject<float>::operator==(other,pQVar1);
  }
  else {
    pQVar1 = &ptr(local_40)->super_QObject<float>;
    other_00 = &ptr(this)->super_QObject<float>;
    this_local._7_1_ = QObject<float>::operator==(pQVar1,other_00);
  }
  return this_local._7_1_;
}

Assistant:

inline bool equals( const QObject< T >& other ) const override {
          using G = PointerGate2< T > ;
          if ( const G* p = dynamic_cast< const G* >( &other ) ) {
            return *p->ptr() == *this->ptr() ;
          }
          return other == *this->ptr() ;
        }